

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_stmt.cc
# Opt level: O0

void init_stmt(module *m)

{
  class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *pcVar1;
  class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *pcVar2;
  class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *pcVar3;
  class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *pcVar4;
  class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *pcVar5;
  class_<kratos::CombinationalStmtBlock,std::shared_ptr<kratos::CombinationalStmtBlock>,kratos::StmtBlock>
  *this;
  class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
  *pcVar6;
  class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
  *pcVar7;
  class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
  *pcVar8;
  module_ *this_00;
  class_<kratos::RawStringStmt,std::shared_ptr<kratos::RawStringStmt>,kratos::Stmt> *this_01;
  class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *pcVar9;
  class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
  *pcVar10;
  class_<kratos::EventDelayStmt,_std::shared_ptr<kratos::EventDelayStmt>,_kratos::AuxiliaryStmt>
  *this_02;
  class_<kratos::EventControl> *pcVar11;
  constructor<kratos::EventEdgeType,_kratos::Var_&> local_763 [2];
  constructor<unsigned_long> local_761;
  PyObject *local_760;
  class_<kratos::EventControl> local_758;
  constructor<kratos::EventControl> local_749;
  code *local_748;
  undefined8 local_740;
  PyObject *local_738;
  class_<kratos::EventDelayStmt,_std::shared_ptr<kratos::EventDelayStmt>,_kratos::AuxiliaryStmt>
  local_730;
  code *local_728;
  undefined8 local_720;
  type local_711;
  code *local_710;
  undefined8 local_708;
  code *local_700;
  undefined8 local_6f8;
  offset_in_Var_to_subr local_6e8 [2];
  code *local_6d8;
  undefined8 local_6d0;
  offset_in_Var_to_subr local_6c0 [2];
  type local_6aa;
  type local_6a9;
  code *local_6a8;
  undefined8 local_6a0;
  code *local_698;
  undefined8 local_690;
  offset_in_Var_to_subr local_680 [2];
  code *local_670;
  undefined8 local_668;
  offset_in_Var_to_subr local_658 [2];
  PyObject *local_648;
  class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
  local_640;
  code *local_638;
  undefined8 local_630;
  PyObject *local_628;
  class_<kratos::AuxiliaryStmt,_std::shared_ptr<kratos::AuxiliaryStmt>,_kratos::Stmt> local_620;
  constructor<> local_611;
  PyObject *local_610;
  class_<kratos::BreakStmt,_std::shared_ptr<kratos::BreakStmt>,_kratos::Stmt> local_608;
  code *local_600;
  undefined8 local_5f8;
  type local_5e9;
  code *local_5e8;
  undefined8 local_5e0;
  code *local_5d8;
  undefined8 local_5d0;
  constructor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_long,_long,_long>
  local_5c1;
  PyObject *local_5c0;
  class_<kratos::ForStmt,_std::shared_ptr<kratos::ForStmt>,_kratos::Stmt> local_5b8;
  constructor<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_5ab [2];
  constructor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_5a9;
  PyObject *local_5a8;
  class_<kratos::RawStringStmt,_std::shared_ptr<kratos::RawStringStmt>,_kratos::Stmt> local_5a0;
  type local_594;
  type local_593 [2];
  constructor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_591;
  PyObject *local_590;
  class_<kratos::CommentStmt,_std::shared_ptr<kratos::CommentStmt>,_kratos::Stmt> local_588;
  PyObject *local_580;
  class_<kratos::FinalStmtBlock,_std::shared_ptr<kratos::FinalStmtBlock>,_kratos::StmtBlock>
  local_578;
  PyObject *local_570;
  class_<kratos::InitialStmtBlock,_std::shared_ptr<kratos::InitialStmtBlock>,_kratos::StmtBlock>
  local_568;
  code *local_560;
  undefined8 local_558;
  PyObject *local_550;
  class_<kratos::BuiltInFunctionStmtBlock,_std::shared_ptr<kratos::BuiltInFunctionStmtBlock>,_kratos::FunctionStmtBlock>
  local_548;
  code *local_540;
  undefined8 local_538;
  code *local_530;
  undefined8 local_528;
  code *local_520;
  undefined8 local_518;
  code *local_510;
  undefined8 local_508;
  code *local_500;
  undefined8 local_4f8;
  code *local_4f0;
  undefined8 local_4e8;
  offset_in_Var_to_subr local_4e0 [2];
  PyObject *local_4d0;
  class_<kratos::DPIFunctionStmtBlock,_std::shared_ptr<kratos::DPIFunctionStmtBlock>,_kratos::FunctionStmtBlock>
  local_4c8;
  PyObject *local_4c0;
  class_<kratos::TaskStmtBlock,_std::shared_ptr<kratos::TaskStmtBlock>,_kratos::FunctionStmtBlock>
  local_4b8;
  code *local_4b0;
  undefined8 local_4a8;
  offset_in_Var_to_subr local_498 [2];
  code *local_488;
  undefined8 local_480;
  offset_in_Var_to_subr local_470 [2];
  code *local_460;
  undefined8 local_458;
  code *local_450;
  undefined8 local_448;
  offset_in_Var_to_subr local_440 [2];
  PyObject *local_430;
  class_<kratos::FunctionStmtBlock,_std::shared_ptr<kratos::FunctionStmtBlock>,_kratos::StmtBlock>
  local_428;
  PyObject *local_420;
  class_<kratos::ReturnStmt,_std::shared_ptr<kratos::ReturnStmt>,_kratos::Stmt> local_418;
  constructor<kratos::Generator_*,_kratos::Generator_*> local_409;
  PyObject *local_408;
  class_<kratos::ModuleInstantiationStmt,_std::shared_ptr<kratos::ModuleInstantiationStmt>,_kratos::Stmt>
  local_400;
  code *local_3f8;
  undefined8 local_3f0;
  code *local_3e8;
  undefined8 local_3e0;
  offset_in_Var_to_subr local_3d0 [2];
  constructor<> local_3b9;
  PyObject *local_3b8;
  class_<kratos::SequentialStmtBlock,_std::shared_ptr<kratos::SequentialStmtBlock>,_kratos::StmtBlock>
  local_3b0;
  constructor<> local_3a1;
  PyObject *local_3a0;
  class_<kratos::ScopedStmtBlock,_std::shared_ptr<kratos::ScopedStmtBlock>,_kratos::StmtBlock>
  local_398;
  constructor<> local_389;
  PyObject *local_388;
  class_<kratos::LatchStmtBlock,_std::shared_ptr<kratos::LatchStmtBlock>,_kratos::StmtBlock>
  local_380;
  code *local_378;
  undefined8 local_370;
  code *local_368;
  undefined8 local_360;
  constructor<> local_351;
  PyObject *local_350;
  class_<kratos::CombinationalStmtBlock,_std::shared_ptr<kratos::CombinationalStmtBlock>,_kratos::StmtBlock>
  local_348;
  keep_alive<0UL,_1UL> local_33d;
  type local_33c;
  type local_33b;
  type local_33a;
  type local_339;
  _func_void_StmtBlock_ptr_shared_ptr<kratos::FunctionCallVar>_ptr *local_338;
  offset_in_Var_to_subr local_330 [2];
  code *local_320;
  undefined8 local_318;
  offset_in_Var_to_subr local_308 [2];
  code *local_2f8;
  undefined8 local_2f0;
  PyObject *local_2e8;
  class_<kratos::StmtBlock,_std::shared_ptr<kratos::StmtBlock>,_kratos::Stmt> local_2e0;
  code *local_2d8;
  undefined8 local_2d0;
  offset_in_Var_to_subr local_2c0 [2];
  code *local_2b0;
  undefined8 local_2a8;
  offset_in_Var_to_subr local_298 [2];
  code *local_288;
  undefined8 local_280;
  return_value_policy local_271;
  code *local_270;
  undefined8 local_268;
  code *local_260;
  undefined8 local_258;
  offset_in_Var_to_subr local_248 [2];
  code *local_238;
  undefined8 local_230;
  offset_in_Var_to_subr local_220 [2];
  constructor<const_std::shared_ptr<kratos::Var>_&> local_209;
  PyObject *local_208;
  class_<kratos::SwitchStmt,_std::shared_ptr<kratos::SwitchStmt>,_kratos::Stmt> local_200;
  code *local_1f8;
  undefined8 local_1f0;
  offset_in_Var_to_subr local_1e0 [2];
  code *local_1d0;
  undefined8 local_1c8;
  offset_in_Var_to_subr local_1b8 [2];
  code *local_1a8;
  undefined8 local_1a0;
  offset_in_Var_to_subr local_190 [2];
  code *local_180;
  undefined8 local_178;
  offset_in_Var_to_subr local_168 [2];
  code *local_158;
  undefined8 local_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 local_130;
  code *local_128;
  undefined8 local_120;
  return_value_policy local_111;
  code *local_110;
  undefined8 local_108;
  constructor<std::shared_ptr<kratos::Var>_> local_f9;
  PyObject *local_f8;
  class_<kratos::IfStmt,_std::shared_ptr<kratos::IfStmt>,_kratos::Stmt> local_f0;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 local_d0;
  code *local_c8;
  undefined8 local_c0;
  return_value_policy local_b4;
  anon_class_1_0_00000001 local_b3;
  return_value_policy local_b2;
  anon_class_1_0_00000001 local_b1;
  code *local_b0;
  undefined8 local_a8;
  code *local_a0;
  undefined8 local_98;
  PyObject *local_90;
  class_<kratos::AssignStmt,_std::shared_ptr<kratos::AssignStmt>,_kratos::Stmt> local_88;
  class_<kratos::AssignStmt,_std::shared_ptr<kratos::AssignStmt>,_kratos::Stmt> assign_;
  offset_in_Var_to_subr local_70 [2];
  anon_class_1_0_00000001 local_5a;
  type local_59;
  offset_in_Var_to_subr local_58 [2];
  code *local_48;
  undefined8 local_40;
  constructor<kratos::StatementType> local_21;
  PyObject *local_20;
  class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_> local_18;
  class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_> stmt_;
  module *m_local;
  
  local_20 = (m->super_object).super_handle.m_ptr;
  stmt_.super_generic_type.super_object.super_handle.m_ptr = (generic_type)(generic_type)m;
  pybind11::class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_>::class_<>
            (&local_18,(handle)local_20,"Stmt");
  pybind11::init<kratos::StatementType>();
  pcVar1 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_>::
           def<kratos::StatementType>(&local_18,&local_21);
  local_48 = kratos::Stmt::type;
  local_40 = 0;
  pcVar1 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
           def<kratos::StatementType(kratos::Stmt::*)()const>
                     (pcVar1,"type",(offset_in_Var_to_subr *)&local_48);
  local_58[1] = 0;
  local_58[0] = 0x41;
  pcVar1 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
           def<void(kratos::Stmt::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool)>
                     (pcVar1,"add_scope_variable",local_58);
  pcVar1 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
           def<init_stmt(pybind11::module_&)::__0>(pcVar1,"add_scope_variable",&local_59);
  pcVar1 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
           def_property_readonly<init_stmt(pybind11::module_&)::__1>
                     (pcVar1,"scope_context",&local_5a);
  local_70[1] = 0;
  local_70[0] = 0x39;
  pcVar1 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
           def<void(kratos::Stmt::*)(kratos::IRNode*)>(pcVar1,"set_parent",local_70);
  assign_.super_generic_type.super_object.super_handle.m_ptr = (generic_type)(object)0x59;
  pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
  def<std::shared_ptr<kratos::Stmt>(kratos::Stmt::*)()const>
            (pcVar1,"clone",(offset_in_Var_to_subr *)&assign_);
  def_trace<pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>,kratos::Stmt>(&local_18);
  def_attributes<pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>,kratos::Stmt>
            (&local_18);
  local_90 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::AssignStmt,_std::shared_ptr<kratos::AssignStmt>,_kratos::Stmt>::
  class_<char[21]>(&local_88,(handle)local_90,"AssignStmt",(char (*) [21])"Assignment statement");
  local_a0 = kratos::AssignStmt::assign_type;
  local_98 = 0;
  pcVar2 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def<kratos::AssignmentType(kratos::AssignStmt::*)()const>
                     ((class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *
                      )&local_88,"assign_type",(offset_in_Var_to_subr *)&local_a0);
  local_b0 = kratos::AssignStmt::set_assign_type;
  local_a8 = 0;
  pcVar2 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def<void(kratos::AssignStmt::*)(kratos::AssignmentType)>
                     (pcVar2,"set_assign_type",(offset_in_Var_to_subr *)&local_b0);
  local_b2 = reference;
  pcVar2 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def_property_readonly<init_stmt(pybind11::module_&)::__2,pybind11::return_value_policy>
                     (pcVar2,"left",&local_b1,&local_b2);
  local_b4 = reference;
  pcVar2 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def_property_readonly<init_stmt(pybind11::module_&)::__3,pybind11::return_value_policy>
                     (pcVar2,"right",&local_b3,&local_b4);
  local_c8 = kratos::AssignStmt::get_delay;
  local_c0 = 0;
  local_d8 = kratos::AssignStmt::set_delay;
  local_d0 = 0;
  pcVar2 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def_property<std::optional<kratos::EventControl>const&(kratos::AssignStmt::*)()const,void(kratos::AssignStmt::*)(std::optional<kratos::EventControl>)>
                     (pcVar2,"delay",(offset_in_Var_to_subr *)&local_c8,
                      (offset_in_Var_to_subr *)&local_d8);
  local_e8 = kratos::AssignStmt::has_delay;
  local_e0 = 0;
  pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
  def_property_readonly<bool(kratos::AssignStmt::*)()const>
            (pcVar2,"has_delay",(offset_in_Var_to_subr *)&local_e8);
  local_f8 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::IfStmt,_std::shared_ptr<kratos::IfStmt>,_kratos::Stmt>::class_<>
            (&local_f0,(handle)local_f8,"IfStmt");
  pybind11::init<std::shared_ptr<kratos::Var>>();
  pcVar3 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::Var>>
                     ((class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
                      &local_f0,&local_f9);
  local_110 = kratos::IfStmt::predicate;
  local_108 = 0;
  local_111 = reference;
  pcVar3 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::Var>(kratos::IfStmt::*)()const,pybind11::return_value_policy>
                     (pcVar3,"predicate",(offset_in_Var_to_subr *)&local_110,&local_111);
  local_128 = kratos::IfStmt::then_body;
  local_120 = 0;
  pcVar3 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::ScopedStmtBlock>const&(kratos::IfStmt::*)()const>
                     (pcVar3,"then_body",(offset_in_Var_to_subr *)&local_128);
  local_138 = kratos::IfStmt::then_body;
  local_130 = 0;
  pcVar3 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def_property_readonly<std::shared_ptr<kratos::ScopedStmtBlock>const&(kratos::IfStmt::*)()const>
                     (pcVar3,"then_",(offset_in_Var_to_subr *)&local_138);
  local_148 = kratos::IfStmt::else_body;
  local_140 = 0;
  pcVar3 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def_property_readonly<std::shared_ptr<kratos::ScopedStmtBlock>const&(kratos::IfStmt::*)()const>
                     (pcVar3,"else_",(offset_in_Var_to_subr *)&local_148);
  local_158 = kratos::IfStmt::else_body;
  local_150 = 0;
  pcVar3 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::ScopedStmtBlock>const&(kratos::IfStmt::*)()const>
                     (pcVar3,"else_body",(offset_in_Var_to_subr *)&local_158);
  local_180 = kratos::IfStmt::add_then_stmt;
  local_178 = 0;
  local_168[0] = pybind11::detail::overload_cast_impl<std::shared_ptr<kratos::Stmt>const&>::
                 operator()(&pybind11::overload_cast<std::shared_ptr<kratos::Stmt>const&>,
                            kratos::IfStmt::add_then_stmt,0);
  pcVar3 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<void(kratos::IfStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar3,"add_then_stmt",local_168);
  local_1a8 = kratos::IfStmt::add_else_stmt;
  local_1a0 = 0;
  local_190[0] = pybind11::detail::overload_cast_impl<std::shared_ptr<kratos::Stmt>const&>::
                 operator()(&pybind11::overload_cast<std::shared_ptr<kratos::Stmt>const&>,
                            kratos::IfStmt::add_else_stmt,0);
  pcVar3 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<void(kratos::IfStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar3,"add_else_stmt",local_190);
  local_1d0 = kratos::IfStmt::remove_then_stmt;
  local_1c8 = 0;
  local_1b8[0] = pybind11::detail::overload_cast_impl<std::shared_ptr<kratos::Stmt>const&>::
                 operator()(&pybind11::overload_cast<std::shared_ptr<kratos::Stmt>const&>,
                            kratos::IfStmt::remove_then_stmt,0);
  pcVar3 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<void(kratos::IfStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar3,"remove_then_stmt",local_1b8);
  local_1f8 = kratos::IfStmt::remove_else_stmt;
  local_1f0 = 0;
  local_1e0[0] = pybind11::detail::overload_cast_impl<std::shared_ptr<kratos::Stmt>const&>::
                 operator()(&pybind11::overload_cast<std::shared_ptr<kratos::Stmt>const&>,
                            kratos::IfStmt::remove_else_stmt,0);
  pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
  def<void(kratos::IfStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
            (pcVar3,"remove_else_stmt",local_1e0);
  pybind11::class_<kratos::IfStmt,_std::shared_ptr<kratos::IfStmt>,_kratos::Stmt>::~class_
            (&local_f0);
  local_208 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::SwitchStmt,_std::shared_ptr<kratos::SwitchStmt>,_kratos::Stmt>::class_<>
            (&local_200,(handle)local_208,"SwitchStmt");
  pybind11::init<std::shared_ptr<kratos::Var>const&>();
  pcVar4 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::Var>const&>
                     ((class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *
                      )&local_200,&local_209);
  local_238 = kratos::SwitchStmt::add_switch_case;
  local_230 = 0;
  local_220[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Stmt>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Stmt>const&>
                              ,kratos::SwitchStmt::add_switch_case,0);
  pcVar4 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<kratos::ScopedStmtBlock&(kratos::SwitchStmt::*)(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar4,"add_switch_case",local_220);
  local_260 = kratos::SwitchStmt::add_switch_case;
  local_258 = 0;
  local_248[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::Const>const&,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::Const>const&,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>const&>
                              ,kratos::SwitchStmt::add_switch_case,0);
  pcVar4 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<kratos::ScopedStmtBlock&(kratos::SwitchStmt::*)(std::shared_ptr<kratos::Const>const&,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>const&)>
                     (pcVar4,"add_switch_case",local_248);
  local_270 = kratos::SwitchStmt::target;
  local_268 = 0;
  local_271 = reference;
  pcVar4 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::Var>(kratos::SwitchStmt::*)()const,pybind11::return_value_policy>
                     (pcVar4,"target",(offset_in_Var_to_subr *)&local_270,&local_271);
  local_288 = kratos::SwitchStmt::body;
  local_280 = 0;
  pcVar4 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<std::map<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::ScopedStmtBlock>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>const&(kratos::SwitchStmt::*)()const>
                     (pcVar4,"body",(offset_in_Var_to_subr *)&local_288);
  local_2b0 = kratos::SwitchStmt::remove_switch_case;
  local_2a8 = 0;
  local_298[0] = pybind11::detail::overload_cast_impl<std::shared_ptr<kratos::Const>const&>::
                 operator()(&pybind11::overload_cast<std::shared_ptr<kratos::Const>const&>,
                            kratos::SwitchStmt::remove_switch_case,0);
  pcVar4 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<void(kratos::SwitchStmt::*)(std::shared_ptr<kratos::Const>const&)>
                     (pcVar4,"remove_switch_case",local_298);
  local_2d8 = kratos::SwitchStmt::remove_switch_case;
  local_2d0 = 0;
  local_2c0[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Stmt>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Stmt>const&>
                              ,kratos::SwitchStmt::remove_switch_case,0);
  pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
  def<void(kratos::SwitchStmt::*)(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Stmt>const&)>
            (pcVar4,"remove_switch_case",local_2c0);
  pybind11::class_<kratos::SwitchStmt,_std::shared_ptr<kratos::SwitchStmt>,_kratos::Stmt>::~class_
            (&local_200);
  local_2e8 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::StmtBlock,_std::shared_ptr<kratos::StmtBlock>,_kratos::Stmt>::class_<>
            (&local_2e0,(handle)local_2e8,"StmtBlock");
  local_2f8 = kratos::StmtBlock::block_type;
  local_2f0 = 0;
  pcVar5 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<kratos::StatementBlockType(kratos::StmtBlock::*)()const>
                     ((class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
                      &local_2e0,"block_type",(offset_in_Var_to_subr *)&local_2f8);
  local_320 = kratos::StmtBlock::add_stmt;
  local_318 = 0;
  local_308[0] = pybind11::detail::overload_cast_impl<std::shared_ptr<kratos::Stmt>const&>::
                 operator()(&pybind11::overload_cast<std::shared_ptr<kratos::Stmt>const&>,
                            kratos::StmtBlock::add_stmt,0);
  pcVar5 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<void(kratos::StmtBlock::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar5,"add_stmt",local_308);
  local_330[1] = 0;
  local_330[0] = 0x51;
  pcVar5 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<void(kratos::StmtBlock::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar5,"remove_stmt",local_330);
  local_338 = add_function_call_var;
  pcVar5 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<void(*)(kratos::StmtBlock&,std::shared_ptr<kratos::FunctionCallVar>const&)>
                     (pcVar5,"add_stmt",&local_338);
  pcVar5 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<init_stmt(pybind11::module_&)::__4>(pcVar5,"__getitem__",&local_339);
  pcVar5 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<init_stmt(pybind11::module_&)::__5>(pcVar5,"__setitem__",&local_33a);
  pcVar5 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<init_stmt(pybind11::module_&)::__6>(pcVar5,"__len__",&local_33b);
  pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
  def<init_stmt(pybind11::module_&)::__7,pybind11::keep_alive<0ul,1ul>>
            (pcVar5,"__iter__",&local_33c,&local_33d);
  pybind11::class_<kratos::StmtBlock,_std::shared_ptr<kratos::StmtBlock>,_kratos::Stmt>::~class_
            (&local_2e0);
  local_350 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::CombinationalStmtBlock,_std::shared_ptr<kratos::CombinationalStmtBlock>,_kratos::StmtBlock>
  ::class_<>(&local_348,(handle)local_350,"CombinationalStmtBlock");
  pybind11::init<>();
  this = (class_<kratos::CombinationalStmtBlock,std::shared_ptr<kratos::CombinationalStmtBlock>,kratos::StmtBlock>
          *)pybind11::
            class_<kratos::CombinationalStmtBlock,_std::shared_ptr<kratos::CombinationalStmtBlock>,_kratos::StmtBlock>
            ::def<>(&local_348,&local_351);
  local_368 = kratos::CombinationalStmtBlock::is_general_purpose;
  local_360 = 0;
  local_378 = kratos::CombinationalStmtBlock::set_general_purpose;
  local_370 = 0;
  pybind11::
  class_<kratos::CombinationalStmtBlock,std::shared_ptr<kratos::CombinationalStmtBlock>,kratos::StmtBlock>
  ::
  def_property<bool(kratos::CombinationalStmtBlock::*)()const,void(kratos::CombinationalStmtBlock::*)(bool)>
            (this,"general_purpose",(offset_in_Var_to_subr *)&local_368,
             (offset_in_Var_to_subr *)&local_378);
  pybind11::
  class_<kratos::CombinationalStmtBlock,_std::shared_ptr<kratos::CombinationalStmtBlock>,_kratos::StmtBlock>
  ::~class_(&local_348);
  local_388 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::LatchStmtBlock,_std::shared_ptr<kratos::LatchStmtBlock>,_kratos::StmtBlock>::
  class_<>(&local_380,(handle)local_388,"LatchStmtBlock");
  pybind11::init<>();
  pybind11::
  class_<kratos::LatchStmtBlock,_std::shared_ptr<kratos::LatchStmtBlock>,_kratos::StmtBlock>::def<>
            (&local_380,&local_389);
  pybind11::
  class_<kratos::LatchStmtBlock,_std::shared_ptr<kratos::LatchStmtBlock>,_kratos::StmtBlock>::
  ~class_(&local_380);
  local_3a0 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::ScopedStmtBlock,_std::shared_ptr<kratos::ScopedStmtBlock>,_kratos::StmtBlock>::
  class_<>(&local_398,(handle)local_3a0,"ScopedStmtBlock");
  pybind11::init<>();
  pybind11::
  class_<kratos::ScopedStmtBlock,_std::shared_ptr<kratos::ScopedStmtBlock>,_kratos::StmtBlock>::
  def<>(&local_398,&local_3a1);
  pybind11::
  class_<kratos::ScopedStmtBlock,_std::shared_ptr<kratos::ScopedStmtBlock>,_kratos::StmtBlock>::
  ~class_(&local_398);
  local_3b8 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::SequentialStmtBlock,_std::shared_ptr<kratos::SequentialStmtBlock>,_kratos::StmtBlock>
  ::class_<>(&local_3b0,(handle)local_3b8,"SequentialStmtBlock");
  pybind11::init<>();
  pcVar6 = (class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::SequentialStmtBlock,_std::shared_ptr<kratos::SequentialStmtBlock>,_kratos::StmtBlock>
              ::def<>(&local_3b0,&local_3b9);
  local_3e8 = kratos::SequentialStmtBlock::get_event_controls;
  local_3e0 = 0;
  local_3d0[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            kratos::SequentialStmtBlock::get_event_controls,0);
  pcVar6 = (class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
              ::
              def<std::vector<kratos::EventControl,std::allocator<kratos::EventControl>>&(kratos::SequentialStmtBlock::*)()>
                        (pcVar6,"get_event_controls",local_3d0);
  local_3f8 = kratos::SequentialStmtBlock::add_condition;
  local_3f0 = 0;
  pybind11::
  class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
  ::
  def<void(kratos::SequentialStmtBlock::*)(std::pair<kratos::EventEdgeType,std::shared_ptr<kratos::Var>>const&)>
            (pcVar6,"add_condition",(offset_in_Var_to_subr *)&local_3f8);
  pybind11::
  class_<kratos::SequentialStmtBlock,_std::shared_ptr<kratos::SequentialStmtBlock>,_kratos::StmtBlock>
  ::~class_(&local_3b0);
  local_408 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::ModuleInstantiationStmt,_std::shared_ptr<kratos::ModuleInstantiationStmt>,_kratos::Stmt>
  ::class_<>(&local_400,(handle)local_408,"ModuleInstantiationStmt");
  pybind11::init<kratos::Generator*,kratos::Generator*>();
  pybind11::
  class_<kratos::ModuleInstantiationStmt,std::shared_ptr<kratos::ModuleInstantiationStmt>,kratos::Stmt>
  ::def<kratos::Generator*,kratos::Generator*>
            ((class_<kratos::ModuleInstantiationStmt,std::shared_ptr<kratos::ModuleInstantiationStmt>,kratos::Stmt>
              *)&local_400,&local_409);
  pybind11::
  class_<kratos::ModuleInstantiationStmt,_std::shared_ptr<kratos::ModuleInstantiationStmt>,_kratos::Stmt>
  ::~class_(&local_400);
  local_420 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::ReturnStmt,_std::shared_ptr<kratos::ReturnStmt>,_kratos::Stmt>::class_<>
            (&local_418,(handle)local_420,"ReturnStmt");
  pybind11::class_<kratos::ReturnStmt,_std::shared_ptr<kratos::ReturnStmt>,_kratos::Stmt>::~class_
            (&local_418);
  local_430 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::FunctionStmtBlock,_std::shared_ptr<kratos::FunctionStmtBlock>,_kratos::StmtBlock>::
  class_<>(&local_428,(handle)local_430,"FunctionStmtBlock");
  local_440[1] = 0;
  local_440[0] = 0x69;
  pcVar7 = (class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
              ::
              def<std::shared_ptr<kratos::Port>(kratos::FunctionStmtBlock::*)(std::__cxx11::string_const&,unsigned_int,bool)>
                        ((class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
                          *)&local_428,"input",local_440);
  local_450 = kratos::FunctionStmtBlock::return_stmt;
  local_448 = 0;
  pcVar7 = (class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
              ::
              def<std::shared_ptr<kratos::ReturnStmt>(kratos::FunctionStmtBlock::*)(std::shared_ptr<kratos::Var>const&)>
                        (pcVar7,"return_stmt",(offset_in_Var_to_subr *)&local_450);
  local_460 = kratos::FunctionStmtBlock::get_port;
  local_458 = 0;
  pcVar7 = (class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
              ::
              def<std::shared_ptr<kratos::Port>(kratos::FunctionStmtBlock::*)(std::__cxx11::string_const&)>
                        (pcVar7,"get_port",(offset_in_Var_to_subr *)&local_460);
  local_488 = kratos::FunctionStmtBlock::set_port_ordering;
  local_480 = 0;
  local_470[0] = pybind11::detail::
                 overload_cast_impl<std::map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>const&>
                              ,kratos::FunctionStmtBlock::set_port_ordering,0);
  pcVar7 = (class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
              ::
              def<void(kratos::FunctionStmtBlock::*)(std::map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>const&)>
                        (pcVar7,"set_port_ordering",local_470);
  local_4b0 = kratos::FunctionStmtBlock::set_port_ordering;
  local_4a8 = 0;
  local_498[0] = pybind11::detail::
                 overload_cast_impl<std::map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>const&>
                              ,kratos::FunctionStmtBlock::set_port_ordering,0);
  pybind11::
  class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>::
  def<void(kratos::FunctionStmtBlock::*)(std::map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>const&)>
            (pcVar7,"set_port_ordering",local_498);
  pybind11::
  class_<kratos::FunctionStmtBlock,_std::shared_ptr<kratos::FunctionStmtBlock>,_kratos::StmtBlock>::
  ~class_(&local_428);
  local_4c0 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::TaskStmtBlock,_std::shared_ptr<kratos::TaskStmtBlock>,_kratos::FunctionStmtBlock>::
  class_<>(&local_4b8,(handle)local_4c0,"TaskStmtBlock");
  pybind11::
  class_<kratos::TaskStmtBlock,_std::shared_ptr<kratos::TaskStmtBlock>,_kratos::FunctionStmtBlock>::
  ~class_(&local_4b8);
  local_4d0 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::DPIFunctionStmtBlock,_std::shared_ptr<kratos::DPIFunctionStmtBlock>,_kratos::FunctionStmtBlock>
  ::class_<>(&local_4c8,(handle)local_4d0,"DPIFunctionStmtBlock");
  local_4e0[1] = 0;
  local_4e0[0] = 0x69;
  pcVar8 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::
              def<std::shared_ptr<kratos::Port>(kratos::DPIFunctionStmtBlock::*)(std::__cxx11::string_const&,unsigned_int,bool)>
                        ((class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
                          *)&local_4c8,"input",local_4e0);
  local_4f0 = kratos::DPIFunctionStmtBlock::output;
  local_4e8 = 0;
  pcVar8 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::
              def<std::shared_ptr<kratos::Port>(kratos::DPIFunctionStmtBlock::*)(std::__cxx11::string_const&,unsigned_int,bool)>
                        (pcVar8,"output",(offset_in_Var_to_subr *)&local_4f0);
  local_500 = kratos::DPIFunctionStmtBlock::set_return_width;
  local_4f8 = 0;
  pcVar8 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::def<void(kratos::DPIFunctionStmtBlock::*)(unsigned_int)>
                        (pcVar8,"set_return_width",(offset_in_Var_to_subr *)&local_500);
  local_510 = kratos::DPIFunctionStmtBlock::is_pure;
  local_508 = 0;
  pcVar8 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::def<bool(kratos::DPIFunctionStmtBlock::*)()const>
                        (pcVar8,"is_pure",(offset_in_Var_to_subr *)&local_510);
  local_520 = kratos::DPIFunctionStmtBlock::is_context;
  local_518 = 0;
  pcVar8 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::def<bool(kratos::DPIFunctionStmtBlock::*)()const>
                        (pcVar8,"is_context",(offset_in_Var_to_subr *)&local_520);
  local_530 = kratos::DPIFunctionStmtBlock::set_is_pure;
  local_528 = 0;
  pcVar8 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::def<void(kratos::DPIFunctionStmtBlock::*)(bool)>
                        (pcVar8,"set_is_pure",(offset_in_Var_to_subr *)&local_530);
  local_540 = kratos::DPIFunctionStmtBlock::set_is_context;
  local_538 = 0;
  pybind11::
  class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
  ::def<void(kratos::DPIFunctionStmtBlock::*)(bool)>
            (pcVar8,"set_is_context",(offset_in_Var_to_subr *)&local_540);
  pybind11::
  class_<kratos::DPIFunctionStmtBlock,_std::shared_ptr<kratos::DPIFunctionStmtBlock>,_kratos::FunctionStmtBlock>
  ::~class_(&local_4c8);
  local_550 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::BuiltInFunctionStmtBlock,_std::shared_ptr<kratos::BuiltInFunctionStmtBlock>,_kratos::FunctionStmtBlock>
  ::class_<>(&local_548,(handle)local_550,"BuiltInFunctionStmtBlock");
  local_560 = kratos::BuiltInFunctionStmtBlock::return_width;
  local_558 = 0;
  pybind11::
  class_<kratos::BuiltInFunctionStmtBlock,std::shared_ptr<kratos::BuiltInFunctionStmtBlock>,kratos::FunctionStmtBlock>
  ::def<unsigned_int(kratos::BuiltInFunctionStmtBlock::*)()const>
            ((class_<kratos::BuiltInFunctionStmtBlock,std::shared_ptr<kratos::BuiltInFunctionStmtBlock>,kratos::FunctionStmtBlock>
              *)&local_548,"return_width",(offset_in_Var_to_subr *)&local_560);
  pybind11::
  class_<kratos::BuiltInFunctionStmtBlock,_std::shared_ptr<kratos::BuiltInFunctionStmtBlock>,_kratos::FunctionStmtBlock>
  ::~class_(&local_548);
  local_570 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::InitialStmtBlock,_std::shared_ptr<kratos::InitialStmtBlock>,_kratos::StmtBlock>::
  class_<>(&local_568,(handle)local_570,"InitialStmtBlock");
  pybind11::
  class_<kratos::InitialStmtBlock,_std::shared_ptr<kratos::InitialStmtBlock>,_kratos::StmtBlock>::
  ~class_(&local_568);
  local_580 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::FinalStmtBlock,_std::shared_ptr<kratos::FinalStmtBlock>,_kratos::StmtBlock>::
  class_<>(&local_578,(handle)local_580,"FinalStmtBlock");
  pybind11::
  class_<kratos::FinalStmtBlock,_std::shared_ptr<kratos::FinalStmtBlock>,_kratos::StmtBlock>::
  ~class_(&local_578);
  local_590 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::CommentStmt,_std::shared_ptr<kratos::CommentStmt>,_kratos::Stmt>::
  class_<>(&local_588,(handle)local_590,"CommentStmt");
  pybind11::init<std::__cxx11::string_const>();
  pybind11::class_<kratos::CommentStmt,std::shared_ptr<kratos::CommentStmt>,kratos::Stmt>::
  def<std::__cxx11::string_const>
            ((class_<kratos::CommentStmt,std::shared_ptr<kratos::CommentStmt>,kratos::Stmt> *)
             &local_588,&local_591);
  pybind11::class_<kratos::CommentStmt,_std::shared_ptr<kratos::CommentStmt>,_kratos::Stmt>::~class_
            (&local_588);
  this_00 = pybind11::module_::def<init_stmt(pybind11::module_&)::__8>
                      ((module_ *)stmt_.super_generic_type.super_object.super_handle.m_ptr,"comment"
                       ,local_593);
  pybind11::module_::def<init_stmt(pybind11::module_&)::__9>(this_00,"comment",&local_594);
  local_5a8 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::RawStringStmt,_std::shared_ptr<kratos::RawStringStmt>,_kratos::Stmt>::
  class_<>(&local_5a0,(handle)local_5a8,"RawStringStmt");
  pybind11::init<std::__cxx11::string_const&>();
  this_01 = (class_<kratos::RawStringStmt,std::shared_ptr<kratos::RawStringStmt>,kratos::Stmt> *)
            pybind11::
            class_<kratos::RawStringStmt,std::shared_ptr<kratos::RawStringStmt>,kratos::Stmt>::
            def<std::__cxx11::string_const&>
                      ((class_<kratos::RawStringStmt,std::shared_ptr<kratos::RawStringStmt>,kratos::Stmt>
                        *)&local_5a0,&local_5a9);
  pybind11::init<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>();
  pybind11::class_<kratos::RawStringStmt,std::shared_ptr<kratos::RawStringStmt>,kratos::Stmt>::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            (this_01,local_5ab);
  pybind11::class_<kratos::RawStringStmt,_std::shared_ptr<kratos::RawStringStmt>,_kratos::Stmt>::
  ~class_(&local_5a0);
  local_5c0 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::ForStmt,_std::shared_ptr<kratos::ForStmt>,_kratos::Stmt>::class_<>
            (&local_5b8,(handle)local_5c0,"ForStmt");
  pybind11::init<std::__cxx11::string_const&,long,long,long>();
  pcVar9 = (class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt>::
           def<std::__cxx11::string_const&,long,long,long>
                     ((class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *)
                      &local_5b8,&local_5c1);
  local_5d8 = kratos::ForStmt::get_iter_var;
  local_5d0 = 0;
  pcVar9 = (class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::IterVar>(kratos::ForStmt::*)()const>
                     (pcVar9,"get_iter_var",(offset_in_Var_to_subr *)&local_5d8);
  local_5e8 = kratos::ForStmt::add_stmt;
  local_5e0 = 0;
  pcVar9 = (class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt>::
           def<void(kratos::ForStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar9,"add_stmt",(offset_in_Var_to_subr *)&local_5e8);
  pcVar9 = (class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt>::
           def<init_stmt(pybind11::module_&)::__10>(pcVar9,"add_stmt",&local_5e9);
  local_600 = kratos::ForStmt::get_loop_body;
  local_5f8 = 0;
  pybind11::class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt>::
  def<std::shared_ptr<kratos::ScopedStmtBlock>(kratos::ForStmt::*)()const>
            (pcVar9,"get_loop_body",(offset_in_Var_to_subr *)&local_600);
  pybind11::class_<kratos::ForStmt,_std::shared_ptr<kratos::ForStmt>,_kratos::Stmt>::~class_
            (&local_5b8);
  local_610 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::BreakStmt,_std::shared_ptr<kratos::BreakStmt>,_kratos::Stmt>::class_<>
            (&local_608,(handle)local_610,"BreakStmt");
  pybind11::init<>();
  pybind11::class_<kratos::BreakStmt,_std::shared_ptr<kratos::BreakStmt>,_kratos::Stmt>::def<>
            (&local_608,&local_611);
  pybind11::class_<kratos::BreakStmt,_std::shared_ptr<kratos::BreakStmt>,_kratos::Stmt>::~class_
            (&local_608);
  local_628 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::AuxiliaryStmt,_std::shared_ptr<kratos::AuxiliaryStmt>,_kratos::Stmt>::
  class_<>(&local_620,(handle)local_628,"AuxiliaryStmt");
  local_638 = kratos::AuxiliaryStmt::aux_type;
  local_630 = 0;
  pybind11::class_<kratos::AuxiliaryStmt,std::shared_ptr<kratos::AuxiliaryStmt>,kratos::Stmt>::
  def<kratos::AuxiliaryType(kratos::AuxiliaryStmt::*)()const>
            ((class_<kratos::AuxiliaryStmt,std::shared_ptr<kratos::AuxiliaryStmt>,kratos::Stmt> *)
             &local_620,"aux",(offset_in_Var_to_subr *)&local_638);
  pybind11::class_<kratos::AuxiliaryStmt,_std::shared_ptr<kratos::AuxiliaryStmt>,_kratos::Stmt>::
  ~class_(&local_620);
  local_648 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
  ::class_<>(&local_640,(handle)local_648,"EventTracingStmt");
  local_670 = kratos::EventTracingStmt::terminates;
  local_668 = 0;
  local_658[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            kratos::EventTracingStmt::terminates,0);
  pcVar10 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)()>
                         ((class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
                           *)&local_640,"terminates",local_658);
  local_698 = kratos::EventTracingStmt::terminates;
  local_690 = 0;
  local_680[0] = pybind11::detail::overload_cast_impl<std::__cxx11::string_const&>::operator()
                           ((overload_cast_impl<std::__cxx11::string_const&> *)
                            &pybind11::overload_cast<std::__cxx11::string_const&>,
                            kratos::EventTracingStmt::terminates,0);
  pcVar10 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::
               def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)(std::__cxx11::string_const&)>
                         (pcVar10,"terminates",local_680);
  local_6a8 = kratos::EventTracingStmt::belongs;
  local_6a0 = 0;
  pcVar10 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::
               def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)(std::__cxx11::string_const&)>
                         (pcVar10,"belongs",(offset_in_Var_to_subr *)&local_6a8);
  pcVar10 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::def<init_stmt(pybind11::module_&)::__11>(pcVar10,"belongs",&local_6a9);
  pcVar10 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::def<init_stmt(pybind11::module_&)::__12>(pcVar10,"belongs",&local_6aa);
  local_6d8 = kratos::EventTracingStmt::starts;
  local_6d0 = 0;
  local_6c0[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            kratos::EventTracingStmt::starts,0);
  pcVar10 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)()>
                         (pcVar10,"starts",local_6c0);
  local_700 = kratos::EventTracingStmt::starts;
  local_6f8 = 0;
  local_6e8[0] = pybind11::detail::overload_cast_impl<std::__cxx11::string_const&>::operator()
                           ((overload_cast_impl<std::__cxx11::string_const&> *)
                            &pybind11::overload_cast<std::__cxx11::string_const&>,
                            kratos::EventTracingStmt::starts,0);
  pcVar10 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::
               def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)(std::__cxx11::string_const&)>
                         (pcVar10,"starts",local_6e8);
  local_710 = kratos::EventTracingStmt::matches;
  local_708 = 0;
  pcVar10 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::
               def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)(std::__cxx11::string_const&,std::shared_ptr<kratos::Var>const&)>
                         (pcVar10,"matches",(offset_in_Var_to_subr *)&local_710);
  pcVar10 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::def<init_stmt(pybind11::module_&)::__13>(pcVar10,"matches",&local_711);
  local_728 = kratos::EventTracingStmt::match_values_abi_cxx11_;
  local_720 = 0;
  pybind11::
  class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>::
  def_property_readonly<std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>const&(kratos::EventTracingStmt::*)()const>
            (pcVar10,"match_values",(offset_in_Var_to_subr *)&local_728);
  pybind11::
  class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
  ::~class_(&local_640);
  local_738 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::EventDelayStmt,_std::shared_ptr<kratos::EventDelayStmt>,_kratos::AuxiliaryStmt>::
  class_<>(&local_730,(handle)local_738,"EventDelayStmt");
  local_748 = kratos::EventDelayStmt::event;
  local_740 = 0;
  this_02 = pybind11::
            class_<kratos::EventDelayStmt,std::shared_ptr<kratos::EventDelayStmt>,kratos::AuxiliaryStmt>
            ::def_property_readonly<kratos::EventControl_const&(kratos::EventDelayStmt::*)()const>
                      ((class_<kratos::EventDelayStmt,std::shared_ptr<kratos::EventDelayStmt>,kratos::AuxiliaryStmt>
                        *)&local_730,"event",(offset_in_Var_to_subr *)&local_748);
  pybind11::init<kratos::EventControl>();
  pybind11::
  class_<kratos::EventDelayStmt,_std::shared_ptr<kratos::EventDelayStmt>,_kratos::AuxiliaryStmt>::
  def<kratos::EventControl>(this_02,&local_749);
  pybind11::
  class_<kratos::EventDelayStmt,_std::shared_ptr<kratos::EventDelayStmt>,_kratos::AuxiliaryStmt>::
  ~class_(&local_730);
  local_760 = *(PyObject **)stmt_.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::EventControl>::class_<>(&local_758,(handle)local_760,"EventControl");
  pybind11::init<unsigned_long>();
  pcVar11 = pybind11::class_<kratos::EventControl>::def<unsigned_long>(&local_758,&local_761);
  pybind11::init<kratos::EventEdgeType,kratos::Var&>();
  pcVar11 = pybind11::class_<kratos::EventControl>::def<kratos::EventEdgeType,kratos::Var&>
                      (pcVar11,local_763);
  pcVar11 = pybind11::class_<kratos::EventControl>::
            def_readwrite<kratos::EventControl,kratos::EventControl::DelaySide>
                      (pcVar11,"delay_side",0x18);
  pcVar11 = pybind11::class_<kratos::EventControl>::
            def_readwrite<kratos::EventControl,unsigned_long>(pcVar11,"delay",0);
  pybind11::class_<kratos::EventControl>::def_readwrite<kratos::EventControl,kratos::EventEdgeType>
            (pcVar11,"edge",0x14);
  pybind11::class_<kratos::EventControl>::~class_(&local_758);
  pybind11::class_<kratos::AssignStmt,_std::shared_ptr<kratos::AssignStmt>,_kratos::Stmt>::~class_
            (&local_88);
  pybind11::class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_>::~class_(&local_18);
  return;
}

Assistant:

void init_stmt(py::module &m) {
    using namespace kratos;
    py::class_<Stmt, ::shared_ptr<Stmt>> stmt_(m, "Stmt");
    stmt_.def(py::init<StatementType>())
        .def("type", &Stmt::type)
        .def("add_scope_variable", &Stmt::add_scope_variable)
        .def("add_scope_variable",
             [](Stmt &stmt, const std::string &name, const std::string &value, bool is_var) {
                 stmt.add_scope_variable(name, value, is_var, false);
             })
        .def_property_readonly("scope_context", [](Stmt &stmt) { return stmt.scope_context(); })
        .def("set_parent", &Stmt::set_parent)
        .def("clone", &Stmt::clone);

    def_trace<py::class_<Stmt, ::shared_ptr<Stmt>>, Stmt>(stmt_);
    def_attributes<py::class_<Stmt, ::shared_ptr<Stmt>>, Stmt>(stmt_);

    py::class_<AssignStmt, ::shared_ptr<AssignStmt>, Stmt> assign_(
        m, "AssignStmt", R"pbdoc(Assignment statement)pbdoc");
    assign_.def("assign_type", &AssignStmt::assign_type)
        .def("set_assign_type", &AssignStmt::set_assign_type)
        .def_property_readonly(
            "left", [](const AssignStmt &stmt) { return stmt.left(); },
            py::return_value_policy::reference)
        .def_property_readonly(
            "right", [](const AssignStmt &stmt) { return stmt.right(); },
            py::return_value_policy::reference)
        .def_property("delay", &AssignStmt::get_delay, &AssignStmt::set_delay)
        .def_property_readonly("has_delay", &AssignStmt::has_delay);

    py::class_<IfStmt, ::shared_ptr<IfStmt>, Stmt>(m, "IfStmt")
        .def(py::init<::shared_ptr<Var>>())
        .def("predicate", &IfStmt::predicate, py::return_value_policy::reference)
        .def("then_body", &IfStmt::then_body)
        .def_property_readonly("then_", &IfStmt::then_body)
        .def_property_readonly("else_", &IfStmt::else_body)
        .def("else_body", &IfStmt::else_body)
        .def("add_then_stmt", py::overload_cast<const ::shared_ptr<Stmt> &>(&IfStmt::add_then_stmt))
        .def("add_else_stmt", py::overload_cast<const ::shared_ptr<Stmt> &>(&IfStmt::add_else_stmt))
        .def("remove_then_stmt",
             py::overload_cast<const ::shared_ptr<Stmt> &>(&IfStmt::remove_then_stmt))
        .def("remove_else_stmt",
             py::overload_cast<const ::shared_ptr<Stmt> &>(&IfStmt::remove_else_stmt));

    py::class_<SwitchStmt, ::shared_ptr<SwitchStmt>, Stmt>(m, "SwitchStmt")
        .def(py::init<const ::shared_ptr<Var> &>())
        .def("add_switch_case",
             py::overload_cast<const std::shared_ptr<Const> &, const std::shared_ptr<Stmt> &>(
                 &SwitchStmt::add_switch_case))
        .def("add_switch_case", py::overload_cast<const std::shared_ptr<Const> &,
                                                  const std::vector<std::shared_ptr<Stmt>> &>(
                                    &SwitchStmt::add_switch_case))
        .def("target", &SwitchStmt::target, py::return_value_policy::reference)
        .def("body", &SwitchStmt::body)
        .def("remove_switch_case", py::overload_cast<const std::shared_ptr<kratos::Const> &>(
                                       &SwitchStmt::remove_switch_case))
        .def("remove_switch_case",
             py::overload_cast<const std::shared_ptr<Const> &, const std::shared_ptr<Stmt> &>(
                 &SwitchStmt::remove_switch_case));

    py::class_<StmtBlock, ::shared_ptr<StmtBlock>, Stmt>(m, "StmtBlock")
        .def("block_type", &StmtBlock::block_type)
        .def("add_stmt", py::overload_cast<const ::shared_ptr<Stmt> &>(&StmtBlock::add_stmt))
        .def("remove_stmt", &StmtBlock::remove_stmt)
        .def("add_stmt", &add_function_call_var)
        .def("__getitem__",
             [](StmtBlock &stmt, int index) {
                 if (stmt.empty()) {
                     throw UserException("Index of out range");
                 }
                 while (index < 0) {
                     index += stmt.size();
                 }
                 return stmt.get_stmt(index);
             })
        .def("__setitem__",
             [](StmtBlock &stmt, int index, const std::shared_ptr<Stmt> &value) {
                 if (stmt.empty()) {
                     throw UserException("Index of out range");
                 }
                 while (index < 0) {
                     index += stmt.size();
                 }
                 stmt.set_child(index, value);
             })
        .def("__len__", [](StmtBlock &stmt) { return stmt.size(); })
        .def(
            "__iter__", [](StmtBlock &stmt) { return py::make_iterator(stmt.begin(), stmt.end()); },
            py::keep_alive<0, 1>());

    py::class_<CombinationalStmtBlock, ::shared_ptr<CombinationalStmtBlock>, StmtBlock>(
        m, "CombinationalStmtBlock")
        .def(py::init<>())
        .def_property("general_purpose", &CombinationalStmtBlock::is_general_purpose,
                      &CombinationalStmtBlock::set_general_purpose);

    py::class_<LatchStmtBlock, ::shared_ptr<LatchStmtBlock>, StmtBlock>(m, "LatchStmtBlock")
        .def(py::init<>());

    py::class_<ScopedStmtBlock, ::shared_ptr<ScopedStmtBlock>, StmtBlock>(m, "ScopedStmtBlock")
        .def(py::init<>());

    py::class_<SequentialStmtBlock, ::shared_ptr<SequentialStmtBlock>, StmtBlock>(
        m, "SequentialStmtBlock")
        .def(py::init<>())
        .def("get_event_controls", py::overload_cast<>(&SequentialStmtBlock::get_event_controls))
        .def("add_condition", &SequentialStmtBlock::add_condition);

    py::class_<ModuleInstantiationStmt, ::shared_ptr<ModuleInstantiationStmt>, Stmt>(
        m, "ModuleInstantiationStmt")
        .def(py::init<Generator *, Generator *>());

    py::class_<ReturnStmt, std::shared_ptr<ReturnStmt>, Stmt>(m, "ReturnStmt");  // NOLINT
    py::class_<FunctionStmtBlock, std::shared_ptr<FunctionStmtBlock>, StmtBlock>(
        m, "FunctionStmtBlock")
        .def("input", &FunctionStmtBlock::input)
        .def("return_stmt", &FunctionStmtBlock::return_stmt)
        .def("get_port", &FunctionStmtBlock::get_port)
        .def("set_port_ordering", py::overload_cast<const std::map<std::string, uint32_t> &>(
                                      &FunctionStmtBlock::set_port_ordering))
        .def("set_port_ordering", py::overload_cast<const std::map<uint32_t, std::string> &>(
                                      &FunctionStmtBlock::set_port_ordering));

    py::class_<TaskStmtBlock, std::shared_ptr<TaskStmtBlock>, FunctionStmtBlock>(m,
                                                                                 "TaskStmtBlock");

    py::class_<DPIFunctionStmtBlock, std::shared_ptr<DPIFunctionStmtBlock>, FunctionStmtBlock>(
        m, "DPIFunctionStmtBlock")
        .def("input", &DPIFunctionStmtBlock::input)
        .def("output", &DPIFunctionStmtBlock::output)
        .def("set_return_width", &DPIFunctionStmtBlock::set_return_width)
        .def("is_pure", &DPIFunctionStmtBlock::is_pure)
        .def("is_context", &DPIFunctionStmtBlock::is_context)
        .def("set_is_pure", &DPIFunctionStmtBlock::set_is_pure)
        .def("set_is_context", &DPIFunctionStmtBlock::set_is_context);

    py::class_<BuiltInFunctionStmtBlock, std::shared_ptr<BuiltInFunctionStmtBlock>,
               FunctionStmtBlock>(m, "BuiltInFunctionStmtBlock")
        .def("return_width", &BuiltInFunctionStmtBlock::return_width);

    py::class_<InitialStmtBlock, std::shared_ptr<InitialStmtBlock>, StmtBlock>(m,  // NOLINT
                                                                               "InitialStmtBlock");

    py::class_<FinalStmtBlock, std::shared_ptr<FinalStmtBlock>, StmtBlock>(m,  // NOLINT
                                                                           "FinalStmtBlock");

    py::class_<CommentStmt, std::shared_ptr<CommentStmt>, Stmt>(m, "CommentStmt")
        .def(py::init<const std::string>());
    // help function
    m.def("comment", [](const std::string &comment) {
         auto stmt = std::make_shared<CommentStmt>(comment);
         return stmt;
     }).def("comment", [](const std::string &comment, uint32_t line_width) {
        auto stmt = std::make_shared<CommentStmt>(comment, line_width);
        return stmt;
    });

    py::class_<RawStringStmt, std::shared_ptr<RawStringStmt>, Stmt>(m, "RawStringStmt")
        .def(py::init<const std::string &>())
        .def(py::init<const std::vector<std::string> &>());

    py::class_<ForStmt, std::shared_ptr<ForStmt>, Stmt>(m, "ForStmt")
        .def(py::init<const std::string &, int64_t, int64_t, int64_t>())
        .def("get_iter_var", &ForStmt::get_iter_var)
        .def("add_stmt", &ForStmt::add_stmt)
        .def("add_stmt",
             [](ForStmt &for_, const std::shared_ptr<FunctionCallVar> &var) {
                 add_function_call_var(*for_.get_loop_body(), var);
             })
        .def("get_loop_body", &ForStmt::get_loop_body);

    py::class_<BreakStmt, std::shared_ptr<BreakStmt>, Stmt>(m, "BreakStmt").def(py::init<>());

    py::class_<AuxiliaryStmt, std::shared_ptr<AuxiliaryStmt>, Stmt>(m, "AuxiliaryStmt")
        .def("aux", &AuxiliaryStmt::aux_type);

    py::class_<EventTracingStmt, std::shared_ptr<EventTracingStmt>, AuxiliaryStmt>(
        m, "EventTracingStmt")
        .def("terminates", py::overload_cast<>(&EventTracingStmt::terminates))
        .def("terminates", py::overload_cast<const std::string &>(&EventTracingStmt::terminates))
        .def("belongs", &EventTracingStmt::belongs)
        .def("belongs",
             [](EventTracingStmt &stmt, const Transaction &t) { return stmt.belongs(t.name); })
        .def("belongs",
             [](EventTracingStmt &stmt, const Transaction &t, const std::string &filename,
                uint64_t ln) {
                 auto s = stmt.belongs(t.name);
                 s->fn_name_ln.emplace_back(std::make_pair(filename, ln));
                 return s;
             })
        .def("starts", py::overload_cast<>(&EventTracingStmt::starts))
        .def("starts", py::overload_cast<const std::string &>(&EventTracingStmt::starts))
        .def("matches", &EventTracingStmt::matches)
        .def("matches",
             [](std::shared_ptr<EventTracingStmt> &stmt, const py::kwargs &kwargs) {
                 for (auto const &[n, v] : kwargs) {
                     auto name = py::cast<std::string>(n);
                     auto var = py::cast<std::shared_ptr<Var>>(v);
                     stmt->matches(name, var);
                 }
                 return stmt;
             })
        .def_property_readonly("match_values", &EventTracingStmt::match_values);

    py::class_<EventDelayStmt, std::shared_ptr<EventDelayStmt>, AuxiliaryStmt>(m, "EventDelayStmt")
        .def_property_readonly("event", &EventDelayStmt::event)
        .def(py::init<EventControl>());

    // event control
    py::class_<EventControl>(m, "EventControl")
        .def(py::init<uint64_t>())
        .def(py::init<EventEdgeType, Var &>())
        .def_readwrite("delay_side", &EventControl::delay_side)
        .def_readwrite("delay", &EventControl::delay)
        .def_readwrite("edge", &EventControl::edge);
}